

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_std::utf8_time_put_from_wide::do_put
          (utf8_time_put_from_wide *this,iter_type out,ios_base *param_2,char fill,tm *tm,
          char format,char modifier)

{
  long lVar1;
  streambuf_type *psVar2;
  time_put *ptVar3;
  ulong uVar4;
  undefined7 in_register_00000081;
  uint uVar5;
  iter_type iVar6;
  allocator local_211;
  iter_type out_local;
  locale local_200;
  string tmp;
  string local_1d8;
  wstring wtmp;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wtmps;
  long alStack_b0 [18];
  
  out_local._M_sbuf = out._M_sbuf;
  uVar4 = CONCAT71(in_register_00000081,fill) & 0xffffffff;
  out_local._M_failed = out._M_failed;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&wtmps);
  std::wios::imbue(&local_200);
  std::locale::~locale(&local_200);
  ptVar3 = std::
           use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&this->base_);
  lVar1 = *(long *)((long)alStack_b0 + *(long *)(_wtmps + -0x18));
  (**(code **)(*(long *)ptVar3 + 0x10))
            (ptVar3,lVar1,lVar1 == 0,&wtmps + *(long *)(_wtmps + -0x18),(int)(char)uVar4,tm,
             (int)format,(int)modifier);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)&local_1d8,"UTF-8",&local_211);
  conv::from_utf<wchar_t>(&tmp,&wtmp,&local_1d8,default_method);
  std::__cxx11::string::~string((string *)&local_1d8);
  for (uVar5 = 0; psVar2 = out_local._M_sbuf, uVar5 < tmp._M_string_length; uVar5 = uVar5 + 1) {
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
              (&out_local,tmp._M_dataplus._M_p[uVar5]);
  }
  iVar6._9_7_ = (int7)(uVar4 >> 8);
  iVar6._M_failed = out_local._M_failed;
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::wstring::~wstring((wstring *)&wtmp);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&wtmps);
  iVar6._M_sbuf = psVar2;
  return iVar6;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,char fill,std::tm const *tm,char format,char modifier = 0) const
    {
        std::basic_ostringstream<wchar_t> wtmps;
        wtmps.imbue(base_);
        std::use_facet<std::time_put<wchar_t> >(base_).put(wtmps,wtmps,wchar_t(fill),tm,wchar_t(format),wchar_t(modifier));
        std::wstring wtmp=wtmps.str();
        std::string const tmp = conv::from_utf<wchar_t>(wtmp,"UTF-8");
        for(unsigned i=0;i<tmp.size();i++) {
            *out++ = tmp[i];
        }
        return out;
    }